

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  uint uVar1;
  ImGuiColumns *columns_00;
  ImDrawList *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiColumnData *pIVar5;
  float fVar6;
  float _y;
  float fVar7;
  float fVar8;
  ImGuiCol local_98;
  int local_8c;
  float x_1;
  int n_1;
  ImVec2 local_80;
  float local_78;
  ImU32 local_74;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_64;
  undefined1 local_5c [8];
  ImRect column_hit_rect;
  float column_hit_hw;
  ImGuiID column_id;
  float x;
  ImGuiColumnData *column;
  int n;
  int dragging_column;
  float y2;
  float y1;
  bool is_being_resized;
  ImGuiColumnsFlags flags;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindow();
  columns_00 = (pIVar4->DC).CurrentColumns;
  if (columns_00 == (ImGuiColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                  ,0x1d89,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < columns_00->Count) {
    PopClipRect();
    ImDrawList::ChannelsMerge(pIVar4->DrawList);
  }
  uVar1 = columns_00->Flags;
  fVar6 = ImMax<float>(columns_00->LineMaxY,(pIVar4->DC).CursorPos.y);
  columns_00->LineMaxY = fVar6;
  (pIVar4->DC).CursorPos.y = columns_00->LineMaxY;
  if ((uVar1 & 0x10) == 0) {
    (pIVar4->DC).CursorMaxPos.x = columns_00->HostCursorMaxPosX;
  }
  y2._3_1_ = false;
  if (((uVar1 & 1) == 0) && ((pIVar4->SkipItems & 1U) == 0)) {
    fVar6 = ImMax<float>(columns_00->HostCursorPosY,(pIVar4->ClipRect).Min.y);
    _y = ImMin<float>((pIVar4->DC).CursorPos.y,(pIVar4->ClipRect).Max.y);
    column._4_4_ = -1;
    for (column._0_4_ = 1; (int)column < columns_00->Count; column._0_4_ = (int)column + 1) {
      pIVar5 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,(int)column);
      fVar8 = (pIVar4->Pos).x;
      fVar7 = GetColumnOffset((int)column);
      fVar8 = fVar8 + fVar7;
      column_hit_rect.Max.y = (float)(columns_00->ID + (int)column);
      column_hit_rect.Max.x = 4.0;
      ImVec2::ImVec2(&local_64,fVar8 - 4.0,fVar6);
      ImVec2::ImVec2((ImVec2 *)&col,fVar8 + 4.0,_y);
      ImRect::ImRect((ImRect *)local_5c,&local_64,(ImVec2 *)&col);
      KeepAliveID((ImGuiID)column_hit_rect.Max.y);
      bVar3 = IsClippedEx((ImRect *)local_5c,(ImGuiID)column_hit_rect.Max.y,false);
      if (!bVar3) {
        xi._3_1_ = 0;
        xi._2_1_ = 0;
        if ((uVar1 & 2) == 0) {
          ButtonBehavior((ImRect *)local_5c,(ImGuiID)column_hit_rect.Max.y,(bool *)((long)&xi + 3),
                         (bool *)((long)&xi + 2),0);
          if (((xi._3_1_ & 1) != 0) || ((xi._2_1_ & 1) != 0)) {
            pIVar2->MouseCursor = 4;
          }
          if (((xi._2_1_ & 1) != 0) && ((pIVar5->Flags & 2U) == 0)) {
            column._4_4_ = (int)column;
          }
        }
        if ((xi._2_1_ & 1) == 0) {
          local_98 = 0x1b;
          if ((xi._3_1_ & 1) != 0) {
            local_98 = 0x1c;
          }
        }
        else {
          local_98 = 0x1d;
        }
        local_74 = GetColorU32(local_98,1.0);
        local_78 = (float)(int)fVar8;
        this = pIVar4->DrawList;
        ImVec2::ImVec2(&local_80,local_78,fVar6 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&x_1,local_78,_y);
        ImDrawList::AddLine(this,&local_80,(ImVec2 *)&x_1,local_74,1.0);
      }
    }
    if (column._4_4_ != -1) {
      if ((columns_00->IsBeingResized & 1U) == 0) {
        for (local_8c = 0; local_8c < columns_00->Count + 1; local_8c = local_8c + 1) {
          pIVar5 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_8c);
          fVar6 = pIVar5->OffsetNorm;
          pIVar5 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,local_8c);
          pIVar5->OffsetNormBeforeResize = fVar6;
        }
      }
      y2._3_1_ = true;
      columns_00->IsBeingResized = true;
      fVar6 = GetDraggedColumnOffset(columns_00,column._4_4_);
      SetColumnOffset(column._4_4_,fVar6);
    }
  }
  columns_00->IsBeingResized = y2._3_1_;
  (pIVar4->WorkRect).Min = (columns_00->HostWorkRect).Min;
  (pIVar4->WorkRect).Max = (columns_00->HostWorkRect).Max;
  (pIVar4->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar4->DC).ColumnsOffset.x = 0.0;
  (pIVar4->DC).CursorPos.x =
       (float)(int)((pIVar4->Pos).x + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}